

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlAttrValueSpec::PrettyPrintAttach
          (GdlAttrValueSpec *this,GrcManager *pcman,ostream *strmOut,bool fXml)

{
  GrcSymbolTableEntry *pGVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  _func_int **pp_Var6;
  char *pcVar7;
  GdlExpression *pGVar8;
  int nValue;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->m_fFlattened == true) &&
     ((bVar2 = GrcSymbolTableEntry::IsAttachAtField(this->m_psymName), bVar2 ||
      (bVar2 = GrcSymbolTableEntry::IsAttachWithField(this->m_psymName), bVar2)))) {
    bVar2 = GrcSymbolTableEntry::IsAttachXField(this->m_psymName);
    if (!bVar2) {
      return;
    }
    bVar2 = GrcSymbolTableEntry::IsAttachAtField(this->m_psymName);
    pcVar7 = "with = ";
    if (bVar2) {
      pcVar7 = "at = ";
    }
    std::operator<<(strmOut,pcVar7);
    pGVar8 = this->m_pexpValue;
    if ((pGVar8 != (GdlExpression *)0x0) &&
       (lVar4 = __dynamic_cast(pGVar8,&GdlExpression::typeinfo,&GdlLookupExpression::typeinfo,0),
       lVar4 != 0)) {
      pGVar1 = (GrcSymbolTableEntry *)**(undefined8 **)(*(long *)(lVar4 + 0x38) + 0x28);
      std::__cxx11::string::string((string *)&local_50,"attach",&local_91);
      GrcSymbolTableEntry::FullAbbrevOmit(&local_90,pGVar1,&local_50);
      std::operator<<(strmOut,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_00112341;
    }
    pp_Var6 = pGVar8->_vptr_GdlExpression;
  }
  else {
    bVar2 = GrcSymbolTableEntry::IsAttachOffsetField(this->m_psymName);
    if ((bVar2) &&
       ((iVar3 = (*this->m_pexpValue->_vptr_GdlExpression[7])(this->m_pexpValue,&local_90,0),
        (char)iVar3 != '\0' && ((int)local_90._M_dataplus._M_p == 0)))) {
      return;
    }
    pGVar1 = this->m_psymName;
    std::__cxx11::string::string((string *)&local_70,"attach",&local_91);
    GrcSymbolTableEntry::FullAbbrevOmit(&local_90,pGVar1,&local_70);
    std::operator<<(strmOut,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    poVar5 = std::operator<<(strmOut," ");
    GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_90,this->m_psymOperator);
    poVar5 = std::operator<<(poVar5,(string *)&local_90);
    std::operator<<(poVar5," ");
    std::__cxx11::string::~string((string *)&local_90);
    pGVar8 = this->m_pexpValue;
    pp_Var6 = pGVar8->_vptr_GdlExpression;
  }
  (*pp_Var6[0x1d])(pGVar8,pcman,strmOut,(ulong)fXml,0);
LAB_00112341:
  std::operator<<(strmOut,"; ");
  return;
}

Assistant:

void GdlAttrValueSpec::PrettyPrintAttach(GrcManager * pcman, std::ostream & strmOut, bool fXml)
{
	if (m_fFlattened
		&& (m_psymName->IsAttachAtField() || m_psymName->IsAttachWithField()))
	{
		// A single statement like "attach.at = apt" has been translated into
		// "attach.at.x = apt.x, attach.at.y = apt.y, attach.at.xoffset = apt.xoffset,
		// attach.at.yoffset = apt.yoffset". Just print out one of these, say, the x.
		if (m_psymName->IsAttachXField())
		{
			if (m_psymName->IsAttachAtField())
				strmOut << "at = ";
			else
				strmOut << "with = ";
			GdlLookupExpression * pexpLookup = dynamic_cast<GdlLookupExpression *>(m_pexpValue);
			if (pexpLookup)
			{
				Symbol psym = pexpLookup->Name()->ParentSymbol();
				strmOut << psym->FullAbbrevOmit("attach");
			}
			else
				// strange...
				m_pexpValue->PrettyPrint(pcman, strmOut, fXml);
			strmOut << "; ";
		}
		return;
	}
	
	if (m_psymName->IsAttachOffsetField())
	{
		int nValue;
		if (m_pexpValue->ResolveToInteger(&nValue, false) && nValue == 0)
			// Don't bother putting out something like attach.at.xoffset = 0.
			return;
	}

	strmOut << m_psymName->FullAbbrevOmit("attach");
	strmOut << " " << m_psymOperator->FullAbbrev() << " ";
	m_pexpValue->PrettyPrint(pcman, strmOut, fXml);
	strmOut << "; ";
}